

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token * __thiscall DL::Lexer::look(Token *__return_storage_ptr__,Lexer *this)

{
  line_t lVar1;
  column_t cVar2;
  
  lVar1 = this->mLineNumber;
  cVar2 = this->mColumnNumber;
  next(__return_storage_ptr__,this);
  Token::operator=(&this->mNextToken,__return_storage_ptr__);
  this->mNextLineNumber = this->mLineNumber;
  this->mNextColumnNumber = this->mColumnNumber;
  this->mLineNumber = lVar1;
  this->mColumnNumber = cVar2;
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::look()
{
	line_t l   = mLineNumber;
	column_t c = mColumnNumber;

	Token t = next();
	// Save for next() call
	mNextToken		  = t;
	mNextColumnNumber = mColumnNumber;
	mNextLineNumber   = mLineNumber;

	mColumnNumber = c;
	mLineNumber   = l;
	return t;
}